

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O3

uint32_t __thiscall Potassco::TheoryTerm::size(TheoryTerm *this)

{
  ulong uVar1;
  uint32_t uVar2;
  
  uVar1 = this->data_;
  if (uVar1 != 0xffffffffffffffff) {
    uVar2 = 0;
    if (((uint)uVar1 & 3) == 2) {
      uVar2 = *(uint32_t *)((uVar1 & 0xfffffffffffffffc) + 4);
    }
    return uVar2;
  }
  fail(-2,"Theory_t Potassco::TheoryTerm::type() const",0x4d,"valid()","Invalid term",0);
}

Assistant:

Theory_t TheoryTerm::type() const { POTASSCO_REQUIRE(valid(), "Invalid term"); return static_cast<Theory_t>(data_&typeMask); }